

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin.cpp
# Opt level: O1

Plugin * csm::Plugin::findPlugin(string *pluginName,WarningList *warnings)

{
  pointer __n;
  WarningList *__position;
  int iVar1;
  pthread_mutex_t *__mutex;
  _List_node_base *p_Var2;
  Plugin *unaff_RBP;
  undefined7 uVar3;
  _List_node_base *p_Var4;
  WarningType local_c4;
  WarningList *local_c0;
  string local_b8;
  string local_98;
  Warning local_78;
  
  __mutex = (pthread_mutex_t *)impl();
  if (__mutex != (pthread_mutex_t *)0x0) {
    pthread_mutex_lock(__mutex);
  }
  local_c0 = warnings;
  p_Var2 = (_List_node_base *)getList_abi_cxx11_();
  p_Var4 = p_Var2;
  do {
    p_Var4 = (((_List_base<const_csm::Plugin_*,_std::allocator<const_csm::Plugin_*>_> *)
              &p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var4 == p_Var2) goto LAB_0011b0f5;
    (**(code **)(*(long *)p_Var4[1]._M_next + 0x10))(&local_78);
    __n = (pointer)pluginName->_M_string_length;
    if (__n == local_78.theMessage._M_dataplus._M_p) {
      uVar3 = (undefined7)((ulong)unaff_RBP >> 8);
      if (__n == (pointer)0x0) {
        unaff_RBP = (Plugin *)CONCAT71(uVar3,1);
      }
      else {
        iVar1 = bcmp((pluginName->_M_dataplus)._M_p,(void *)local_78._0_8_,(size_t)__n);
        unaff_RBP = (Plugin *)CONCAT71(uVar3,iVar1 == 0);
      }
    }
    else {
      unaff_RBP = (Plugin *)0x0;
    }
    if ((void *)local_78._0_8_ != (void *)((long)&local_78 + 0x10U)) {
      operator_delete((void *)local_78._0_8_,local_78.theMessage._M_string_length + 1);
    }
  } while ((char)unaff_RBP == '\0');
  unaff_RBP = (Plugin *)p_Var4[1]._M_next;
LAB_0011b0f5:
  __position = local_c0;
  if (p_Var4 == p_Var2) {
    if (local_c0 != (list<csm::Warning,_std::allocator<csm::Warning>_> *)0x0) {
      local_c4 = DATA_NOT_AVAILABLE;
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_98,"No matching plugin found","");
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Plugin::findPlugin","");
      Warning::Warning(&local_78,&local_c4,&local_98,&local_b8);
      std::__cxx11::list<csm::Warning,_std::allocator<csm::Warning>_>::_M_insert<csm::Warning>
                (__position,(iterator)__position,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78.theFunction._M_dataplus._M_p != &local_78.theFunction.field_2) {
        operator_delete(local_78.theFunction._M_dataplus._M_p,
                        local_78.theFunction.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78.theMessage._M_dataplus._M_p != &local_78.theMessage.field_2) {
        operator_delete(local_78.theMessage._M_dataplus._M_p,
                        local_78.theMessage.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
    }
    unaff_RBP = (Plugin *)0x0;
  }
  if (__mutex != (pthread_mutex_t *)0x0) {
    pthread_mutex_unlock(__mutex);
  }
  return unaff_RBP;
}

Assistant:

const Plugin* Plugin::findPlugin(const std:: string& pluginName,
                                 WarningList* warnings)
{
   Impl::Locker locker(impl());

   const PluginList& plugins = getList();

   for (PluginList::const_iterator i = plugins.begin();
        i != plugins.end(); ++i)
   {
      if (pluginName == (*i)->getPluginName())
      {
         return *i;
      }
   }

   // plugin not found
   if (warnings)
   {
      warnings->push_back(Warning(Warning::DATA_NOT_AVAILABLE,
                                  "No matching plugin found",
                                  "Plugin::findPlugin"));
   }

   return NULL;
}